

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_189ea5b::EncodeTxbInitLevelTest::RunTest
          (EncodeTxbInitLevelTest *this,av1_txb_init_levels_func test_func,int tx_size,int is_speed)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *levels;
  SEARCH_METHODS *message;
  int iVar6;
  uint8_t *lhs;
  ulong uVar7;
  int i;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4ae0;
  uint local_4ad8;
  uint local_4ad4;
  ulong local_4ad0;
  double local_4ac8;
  double local_4ac0;
  AssertHelper local_4ab8;
  int local_4ab0;
  ACMRandom rnd;
  AssertionResult gtest_ar;
  aom_usec_timer timer;
  uint8_t levels_buf [2] [1312];
  tran_low_t coeff [4096];
  
  local_4ad0 = CONCAT44(local_4ad0._4_4_,tx_size);
  uVar3 = get_txb_wide((TX_SIZE)test_func);
  uVar4 = get_txb_high((TX_SIZE)test_func);
  rnd.random_.state_ = (Random)0xbaba;
  uVar5 = uVar4 * uVar3;
  uVar7 = 0;
  uVar9 = 0;
  local_4ad8 = uVar3;
  if (0 < (int)uVar5) {
    uVar9 = (ulong)uVar5;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    uVar2 = libaom_test::ACMRandom::Rand16(&rnd);
    coeff[uVar7] = (int)(short)uVar2;
  }
  for (lVar10 = 0; lVar10 != 0x520; lVar10 = lVar10 + 1) {
    uVar1 = libaom_test::ACMRandom::Rand8(&rnd);
    levels_buf[0][lVar10] = uVar1;
    uVar1 = libaom_test::ACMRandom::Rand8(&rnd);
    levels_buf[1][lVar10] = uVar1;
  }
  iVar6 = 1;
  if ((int)local_4ad0 != 0) {
    iVar6 = uVar5 * 10000;
  }
  local_4ad4 = uVar4;
  ::aom_usec_timer_start(&timer);
  iVar8 = 0;
  if (0 < iVar6) {
    iVar8 = iVar6;
  }
  levels = levels_buf[0];
  local_4ab0 = iVar6;
  iVar6 = iVar8;
  while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
    av1_txb_init_levels_c(coeff,local_4ad8,local_4ad4,levels);
  }
  local_4ac8 = get_time_mark(&timer);
  ::aom_usec_timer_start(&timer);
  uVar3 = local_4ad4;
  while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
    (*(code *)this)(coeff,local_4ad8,uVar3);
  }
  local_4ac0 = get_time_mark(&timer);
  uVar4 = local_4ad8;
  if ((int)local_4ad0 != 0) {
    printf("init %3dx%-3d:%7.2f/%7.2fns",local_4ac8,(ulong)local_4ad8,(ulong)uVar3);
    printf("(%3.2f)\n",local_4ac8 / local_4ac0);
  }
  uVar4 = uVar4 + 4;
  local_4ad0 = 0;
  uVar7 = 0;
  if (0 < (int)uVar4) {
    uVar7 = (ulong)uVar4;
  }
  local_4ac8 = (double)(long)(int)uVar4;
  uVar4 = 0xfffffffc;
  if (-4 < (int)uVar3) {
    uVar4 = uVar3;
  }
  local_4ac0 = (double)(ulong)(uVar4 + 4);
  do {
    if ((double)local_4ad0 == local_4ac0) {
      return;
    }
    lhs = levels;
    for (lVar10 = 0; -lVar10 != uVar7; lVar10 = lVar10 + -1) {
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                ((internal *)&gtest_ar,"levels_buf[0][c + r * stride]",
                 "levels_buf[1][c + r * stride]",lhs,(uchar *)(lhs + 0x520));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_4ae0);
        uVar3 = local_4ad4;
        std::operator<<((ostream *)(local_4ae0._M_head_impl + 0x10),"[");
        std::ostream::operator<<(local_4ae0._M_head_impl + 0x10,(int)local_4ad0);
        std::operator<<((ostream *)(local_4ae0._M_head_impl + 0x10),",");
        std::ostream::operator<<(local_4ae0._M_head_impl + 0x10,-(int)lVar10);
        std::operator<<((ostream *)(local_4ae0._M_head_impl + 0x10),"] ");
        std::ostream::operator<<(local_4ae0._M_head_impl + 0x10,local_4ab0);
        std::ostream::operator<<(local_4ae0._M_head_impl + 0x10,local_4ad8);
        std::operator<<((ostream *)(local_4ae0._M_head_impl + 0x10),"x");
        std::ostream::operator<<(local_4ae0._M_head_impl + 0x10,uVar3);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(SEARCH_METHODS **)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4ab8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encodetxb_test.cc"
                   ,0x100,(char *)message);
        testing::internal::AssertHelper::operator=(&local_4ab8,(Message *)&local_4ae0);
        testing::internal::AssertHelper::~AssertHelper(&local_4ab8);
        if (local_4ae0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4ae0._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        return;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      lhs = lhs + 1;
    }
    local_4ad0 = local_4ad0 + 1;
    levels = levels + (long)local_4ac8;
  } while( true );
}

Assistant:

void EncodeTxbInitLevelTest::RunTest(av1_txb_init_levels_func test_func,
                                     int tx_size, int is_speed) {
  const int width = get_txb_wide((TX_SIZE)tx_size);
  const int height = get_txb_high((TX_SIZE)tx_size);
  tran_low_t coeff[MAX_TX_SQUARE];

  uint8_t levels_buf[2][TX_PAD_2D];
  uint8_t *const levels0 = set_levels(levels_buf[0], height);
  uint8_t *const levels1 = set_levels(levels_buf[1], height);

  ACMRandom rnd(ACMRandom::DeterministicSeed());
  for (int i = 0; i < width * height; i++) {
    coeff[i] = rnd.Rand16Signed();
  }
  for (int i = 0; i < TX_PAD_2D; i++) {
    levels_buf[0][i] = rnd.Rand8();
    levels_buf[1][i] = rnd.Rand8();
  }
  const int run_times = is_speed ? (width * height) * 10000 : 1;
  aom_usec_timer timer;
  aom_usec_timer_start(&timer);
  for (int i = 0; i < run_times; ++i) {
    av1_txb_init_levels_c(coeff, width, height, levels0);
  }
  const double t1 = get_time_mark(&timer);
  aom_usec_timer_start(&timer);
  for (int i = 0; i < run_times; ++i) {
    test_func(coeff, width, height, levels1);
  }
  const double t2 = get_time_mark(&timer);
  if (is_speed) {
    printf("init %3dx%-3d:%7.2f/%7.2fns", width, height, t1, t2);
    printf("(%3.2f)\n", t1 / t2);
  }
  const int stride = width + TX_PAD_HOR;
  for (int r = 0; r < height + TX_PAD_VER; ++r) {
    for (int c = 0; c < stride; ++c) {
      ASSERT_EQ(levels_buf[0][c + r * stride], levels_buf[1][c + r * stride])
          << "[" << r << "," << c << "] " << run_times << width << "x"
          << height;
    }
  }
}